

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O1

am_loc_values * create_loc_values(Am_Inter_Location *current_loc,Am_Value *old_val)

{
  bool bVar1;
  am_loc_values *this;
  ostream *poVar2;
  bool as_line;
  Am_Object oref_obj;
  int ob;
  int oa;
  int d;
  int c;
  int b;
  int a;
  Am_Inter_Location old_loc;
  Am_Object ref_obj;
  int od;
  int oc;
  bool local_51;
  Am_Object local_50;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  Am_Inter_Location local_30;
  Am_Object local_28;
  int local_20;
  int local_1c;
  
  this = (am_loc_values *)operator_new(0x60);
  am_loc_values::am_loc_values(this);
  local_28.data = (Am_Object_Data *)0x0;
  Am_Inter_Location::Get_Location
            (current_loc,&local_51,&local_28,&local_34,&local_38,&local_3c,&local_40);
  if (local_51 != true) {
    Am_Inter_Location::operator=(&this->orig_value,current_loc);
    bVar1 = Am_Inter_Location::Get_Growing(current_loc);
    this->growing = bVar1;
    this->left_equals = local_34;
    this->top_equals = local_38;
    this->width_equals = local_3c;
    this->height_equals = local_40;
    bVar1 = Am_Value::Valid(old_val);
    if (bVar1) {
      bVar1 = Am_Inter_Location::Test(old_val);
      if (bVar1) {
        local_50.data = (Am_Object_Data *)0x0;
        Am_Inter_Location::Am_Inter_Location(&local_30,old_val);
        Am_Inter_Location::Get_Location
                  (&local_30,&local_51,&local_50,&local_44,&local_48,&local_1c,&local_20);
        if (local_51 == true) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"**old value is as line ",0x17);
          poVar2 = operator<<((ostream *)&std::cout,&local_30);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
          std::ostream::put((char)poVar2);
          std::ostream::flush();
          std::ostream::flush();
        }
        else {
          bVar1 = Am_Object::operator!=(&local_50,&local_28);
          if (bVar1) {
            Am_Translate_Coordinates(&local_50,local_44,local_48,&local_28,&local_44,&local_48);
          }
          this->left_offset = local_34 - local_44;
          this->top_offset = local_38 - local_48;
          this->width_offset = local_3c - local_1c;
          this->height_offset = local_40 - local_20;
        }
        Am_Inter_Location::~Am_Inter_Location(&local_30);
        Am_Object::~Am_Object(&local_50);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"**Old val not an inter location ",0x20);
        poVar2 = operator<<((ostream *)&std::cout,old_val);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        std::ostream::flush();
      }
    }
    Am_Object::~Am_Object(&local_28);
    return this;
  }
  Am_Error("Shouldn\'t be as_line");
}

Assistant:

am_loc_values *
create_loc_values(Am_Inter_Location &current_loc, Am_Value &old_val)
{
  am_loc_values *ret = new am_loc_values();
  bool as_line;
  int a, b, c, d;
  Am_Object ref_obj;
  current_loc.Get_Location(as_line, ref_obj, a, b, c, d);
  if (as_line)
    Am_Error("Shouldn't be as_line");
  ret->orig_value = current_loc;
  ret->growing = current_loc.Get_Growing();
  ret->left_equals = a;
  ret->top_equals = b;
  ret->width_equals = c;
  ret->height_equals = d;
  if (old_val.Valid()) {
    if (Am_Inter_Location::Test(old_val)) {
      int oa, ob, oc, od;
      Am_Object oref_obj;
      Am_Inter_Location old_loc = old_val;
      old_loc.Get_Location(as_line, oref_obj, oa, ob, oc, od);
      if (as_line) {
        std::cout << "**old value is as line " << old_loc << std::endl
                  << std::flush;
      } else {
        if (oref_obj != ref_obj)
          Am_Translate_Coordinates(oref_obj, oa, ob, ref_obj, oa, ob);
        ret->left_offset = a - oa;
        ret->top_offset = b - ob;
        ret->width_offset = c - oc;
        ret->height_offset = d - od;
      }
    } else {
      std::cout << "**Old val not an inter location " << old_val << std::endl
                << std::flush;
    }
  }
  return ret;
}